

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O0

void gutil::anon_unknown_3::printDescription(ostream *out,string *descr,size_t col,size_t n)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  ostream *in_RDI;
  bool bVar4;
  size_t k;
  size_t c;
  size_t i;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  
  local_28 = 0;
  local_30 = in_RDX;
  while (uVar2 = std::__cxx11::string::size(), local_28 < uVar2) {
    while( true ) {
      uVar2 = std::__cxx11::string::size();
      bVar4 = false;
      if (local_28 < uVar2) {
        pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
        iVar1 = isspace((int)*pcVar3);
        bVar4 = iVar1 != 0;
      }
      if (!bVar4) break;
      local_28 = local_28 + 1;
    }
    local_38 = local_28;
    while( true ) {
      uVar2 = std::__cxx11::string::size();
      bVar4 = false;
      if (local_38 < uVar2) {
        pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
        iVar1 = isspace((int)*pcVar3);
        bVar4 = iVar1 == 0;
      }
      if (!bVar4) break;
      local_38 = local_38 + 1;
    }
    if ((in_RCX < (local_30 + 1 + local_38) - local_28) && (in_RDX < local_30)) {
      std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
      for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
        std::operator<<(in_RDI,' ');
      }
    }
    if (in_RCX < (local_30 + 1 + local_38) - local_28) {
      local_38 = ((local_28 + in_RCX) - local_30) - 1;
    }
    if (local_30 != 0) {
      std::operator<<(in_RDI,' ');
      local_30 = local_30 + 1;
    }
    while (local_28 < local_38) {
      local_28 = local_28 + 1;
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
      std::operator<<(in_RDI,*pcVar3);
      local_30 = local_30 + 1;
    }
  }
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printDescription(std::ostream &out, std::string descr, size_t col, size_t n)
{
  size_t i=0;
  size_t c=col;

  while (i < descr.size())
  {
    while (i<descr.size() && isspace(descr[i]))
    {
      i++;
    }

    size_t k=i;

    while (k < descr.size() && !isspace(descr[k]))
    {
      k++;
    }

    if (c+1+k-i > n && c > col)
    {
      out << std::endl;

      for (c=0; c<col; c++)
      {
        out << ' ';
      }
    }

    if (c+1+k-i > n)
    {
      k=i+n-c-1;
    }

    if (c > 0)
    {
      out << ' ';
      c++;
    }

    while (i < k)
    {
      out << descr[i++];
      c++;
    }
  }

  out << std::endl;
}